

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManComputeTruth_rec(If_DsdMan_t *p,int iDsd,word *pRes,uchar *pPermLits,int *pnSupp)

{
  word **ppwVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  If_DsdObj_t *pObj;
  word *pwVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  word pTtTemp [64];
  word local_1838 [64];
  ulong auStack_1638 [64];
  ulong auStack_1438 [641];
  
  uVar2 = Abc_LitIsCompl(iDsd);
  iVar3 = Abc_Lit2Var(iDsd);
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,iVar3);
  uVar7 = *(uint *)&pObj->field_0x4;
  switch(uVar7 & 7) {
  case 2:
    iVar3 = *pnSupp;
    if (pPermLits == (uchar *)0x0) {
      uVar7 = Abc_Var2Lit(iVar3,0);
      iVar3 = *pnSupp;
    }
    else {
      uVar7 = (uint)pPermLits[iVar3];
    }
    *pnSupp = iVar3 + 1;
    if (iVar3 < p->nVars) {
      ppwVar1 = p->pTtElems;
      uVar4 = Abc_Lit2Var(uVar7);
      pwVar5 = ppwVar1[uVar4];
      iVar3 = p->nWords;
      uVar7 = Abc_LitIsCompl(uVar7);
      Abc_TtCopy(pRes,pwVar5,iVar3,uVar2 ^ uVar7);
      return;
    }
    __assert_fail("(*pnSupp) <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x555,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  case 3:
  case 4:
    if ((uVar7 & 7) == 3) {
      Abc_TtConst1(pRes,p->nWords);
    }
    else {
      Abc_TtConst0(pRes,p->nWords);
    }
    uVar7 = 0;
    while ((uVar7 < *(uint *)&pObj->field_0x4 >> 0x1b &&
           (iVar3 = If_DsdObjFaninLit(pObj,uVar7), iVar3 != 0))) {
      If_DsdManComputeTruth_rec(p,iVar3,local_1838,pPermLits,pnSupp);
      uVar8 = (ulong)(uint)p->nWords;
      if (p->nWords < 1) {
        uVar8 = 0;
      }
      if ((*(uint *)&pObj->field_0x4 & 7) == 3) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          pRes[uVar6] = pRes[uVar6] & local_1838[uVar6];
        }
      }
      else {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          pRes[uVar6] = pRes[uVar6] ^ local_1838[uVar6];
        }
      }
      uVar7 = uVar7 + 1;
    }
    break;
  case 5:
    pwVar5 = local_1838;
    uVar8 = 0;
    while ((uVar8 < uVar7 >> 0x1b && (iVar3 = If_DsdObjFaninLit(pObj,(int)uVar8), iVar3 != 0))) {
      If_DsdManComputeTruth_rec(p,iVar3,pwVar5,pPermLits,pnSupp);
      uVar8 = uVar8 + 1;
      uVar7 = *(uint *)&pObj->field_0x4;
      pwVar5 = pwVar5 + 0x40;
    }
    if (uVar8 != 3) {
      __assert_fail("i == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x570,
                    "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                   );
    }
    uVar7 = p->nWords;
    uVar8 = 0;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pRes[uVar8] = (auStack_1638[uVar8] ^ auStack_1438[uVar8]) & local_1838[uVar8] ^
                    auStack_1438[uVar8];
    }
    if (uVar2 == 0) {
      return;
    }
    goto LAB_00388de4;
  case 6:
    pwVar5 = local_1838;
    uVar8 = 0;
    while ((uVar8 < uVar7 >> 0x1b && (iVar3 = If_DsdObjFaninLit(pObj,(int)uVar8), iVar3 != 0))) {
      If_DsdManComputeTruth_rec(p,iVar3,pwVar5,pPermLits,pnSupp);
      uVar8 = uVar8 + 1;
      uVar7 = *(uint *)&pObj->field_0x4;
      pwVar5 = pwVar5 + 0x40;
    }
    pwVar5 = If_DsdObjTruth(p,pObj);
    Dau_DsdTruthCompose_rec(pwVar5,&local_1838,pRes,*(uint *)&pObj->field_0x4 >> 0x1b,p->nWords);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x57e,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  }
  if (uVar2 != 0) {
    uVar7 = p->nWords;
LAB_00388de4:
    Abc_TtNot(pRes,uVar7);
  }
  return;
}

Assistant:

void If_DsdManComputeTruth_rec( If_DsdMan_t * p, int iDsd, word * pRes, unsigned char * pPermLits, int * pnSupp )
{
    int i, iFanin, fCompl = Abc_LitIsCompl(iDsd);
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[*pnSupp] : Abc_Var2Lit(*pnSupp, 0);
        (*pnSupp)++;
        assert( (*pnSupp) <= p->nVars );
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, fCompl ^ Abc_LitIsCompl(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        word pTtTemp[DAU_MAX_WORD];
        if ( If_DsdObjType(pObj) == IF_DSD_AND )
            Abc_TtConst1( pRes, p->nWords );
        else
            Abc_TtConst0( pRes, p->nWords );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp, pPermLits, pnSupp );
            if ( If_DsdObjType(pObj) == IF_DSD_AND )
                Abc_TtAnd( pRes, pRes, pTtTemp, p->nWords, 0 );
            else
                Abc_TtXor( pRes, pRes, pTtTemp, p->nWords, 0 );
        }
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX ) // mux
    {
        word pTtTemp[3][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp[i], pPermLits, pnSupp );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME ) // function
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pFanins[i], pPermLits, pnSupp );
        Dau_DsdTruthCompose_rec( If_DsdObjTruth(p, pObj), pFanins, pRes, pObj->nFans, p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    assert( 0 );

}